

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_font * nk_font_atlas_add(nk_font_atlas *atlas,nk_font_config *config)

{
  undefined8 *puVar1;
  nk_plugin_alloc p_Var2;
  nk_font_config *pnVar3;
  long lVar4;
  nk_font *pnVar5;
  nk_font_config *dst0;
  nk_font *__s;
  void *dst0_00;
  nk_font_config *pnVar6;
  nk_font *pnVar7;
  ulong __n;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2f72,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  p_Var2 = (atlas->permanent).alloc;
  if (p_Var2 == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2f73,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2f74,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2f75,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2f76,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config == (nk_font_config *)0x0) {
    __assert_fail("config",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2f78,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config->ttf_blob == (void *)0x0) {
    __assert_fail("config->ttf_blob",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2f79,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config->ttf_size == 0) {
    __assert_fail("config->ttf_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2f7a,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  if (config->size <= 0.0) {
    __assert_fail("config->size > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x2f7b,
                  "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                 );
  }
  dst0 = (nk_font_config *)(*p_Var2)((atlas->permanent).userdata,(void *)0x0,0x58);
  nk_memcopy(dst0,config,0x58);
  dst0->n = dst0;
  dst0->p = dst0;
  if (config->merge_mode == '\0') {
    pnVar3 = atlas->config;
    if (atlas->config == (nk_font_config *)0x0) {
      pnVar6 = (nk_font_config *)&atlas->config;
    }
    else {
      do {
        pnVar6 = pnVar3;
        pnVar3 = pnVar6->next;
      } while (pnVar6->next != (nk_font_config *)0x0);
    }
    pnVar6->next = dst0;
    dst0->next = (nk_font_config *)0x0;
    __s = (nk_font *)(*(atlas->permanent).alloc)((atlas->permanent).userdata,(void *)0x0,0x80);
    if (__s == (nk_font *)0x0) {
      __assert_fail("font",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x2f97,
                    "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                   );
    }
    __n = (ulong)__s & 3;
    if (__n == 0) {
      __s->fallback = (nk_font_glyph *)0x0;
      *(undefined8 *)&__s->fallback_codepoint = 0;
      *(undefined8 *)&__s->scale = 0;
      __s->glyphs = (nk_font_glyph *)0x0;
      *(undefined8 *)&(__s->info).glyph_count = 0;
      (__s->info).ranges = (nk_rune *)0x0;
      (__s->info).height = 0.0;
      (__s->info).ascent = 0.0;
      (__s->info).descent = 0.0;
      (__s->info).glyph_offset = 0;
      (__s->handle).query = (nk_query_font_glyph_f)0x0;
      (__s->handle).texture.ptr = (void *)0x0;
      *(undefined8 *)&(__s->handle).height = 0;
      (__s->handle).width = (nk_text_width_f)0x0;
      __s->next = (nk_font *)0x0;
      (__s->handle).userdata.ptr = (void *)0x0;
      (__s->texture).ptr = (void *)0x0;
    }
    else {
      lVar4 = -__n;
      memset(__s,0,lVar4 + 4U);
      puVar1 = (undefined8 *)((long)__s + lVar4 + 4U);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)__s + lVar4 + 0x14);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)__s + lVar4 + 0x24);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)__s + lVar4 + 0x34);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)__s + lVar4 + 0x44);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)__s + lVar4 + 0x54);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)__s + lVar4 + 100);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)__s + lVar4 + 0x70);
      *puVar1 = 0;
      puVar1[1] = 0;
      memset((void *)((long)__s + lVar4 + 0x80),0,__n);
    }
    __s->config = dst0;
    pnVar5 = atlas->fonts;
    if (atlas->fonts == (nk_font *)0x0) {
      pnVar7 = (nk_font *)&atlas->fonts;
    }
    else {
      do {
        pnVar7 = pnVar5;
        pnVar5 = pnVar7->next;
      } while (pnVar7->next != (nk_font *)0x0);
    }
    pnVar7->next = __s;
    __s->next = (nk_font *)0x0;
    dst0->font = &__s->info;
  }
  else {
    if (atlas->font_num == 0) {
      __assert_fail("atlas->font_num",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x2fab,
                    "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                   );
    }
    pnVar3 = atlas->fonts->config;
    dst0->font = &atlas->fonts->info;
    dst0->n = pnVar3;
    pnVar6 = pnVar3->p;
    dst0->p = pnVar6;
    pnVar6->n = dst0;
    pnVar3->p = dst0;
    __s = (nk_font *)0x0;
  }
  if (config->ttf_data_owned_by_atlas == '\0') {
    dst0_00 = (*(atlas->permanent).alloc)((atlas->permanent).userdata,(void *)0x0,dst0->ttf_size);
    dst0->ttf_blob = dst0_00;
    if (dst0_00 == (void *)0x0) {
      __assert_fail("cfg->ttf_blob",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x2fb8,
                    "struct nk_font *nk_font_atlas_add(struct nk_font_atlas *, const struct nk_font_config *)"
                   );
    }
    nk_memcopy(dst0_00,config->ttf_blob,dst0->ttf_size);
    dst0->ttf_data_owned_by_atlas = '\x01';
  }
  atlas->font_num = atlas->font_num + 1;
  return __s;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add(struct nk_font_atlas *atlas, const struct nk_font_config *config)
{
    struct nk_font *font = 0;
    struct nk_font_config *cfg;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);

    NK_ASSERT(config);
    NK_ASSERT(config->ttf_blob);
    NK_ASSERT(config->ttf_size);
    NK_ASSERT(config->size > 0.0f);

    if (!atlas || !config || !config->ttf_blob || !config->ttf_size || config->size <= 0.0f||
        !atlas->permanent.alloc || !atlas->permanent.free ||
        !atlas->temporary.alloc || !atlas->temporary.free)
        return 0;

    /* allocate font config  */
    cfg = (struct nk_font_config*)
        atlas->permanent.alloc(atlas->permanent.userdata,0, sizeof(struct nk_font_config));
    NK_MEMCPY(cfg, config, sizeof(*config));
    cfg->n = cfg;
    cfg->p = cfg;

    if (!config->merge_mode) {
        /* insert font config into list */
        if (!atlas->config) {
            atlas->config = cfg;
            cfg->next = 0;
        } else {
            struct nk_font_config *i = atlas->config;
            while (i->next) i = i->next;
            i->next = cfg;
            cfg->next = 0;
        }
        /* allocate new font */
        font = (struct nk_font*)
            atlas->permanent.alloc(atlas->permanent.userdata,0, sizeof(struct nk_font));
        NK_ASSERT(font);
        nk_zero(font, sizeof(*font));
        if (!font) return 0;
        font->config = cfg;

        /* insert font into list */
        if (!atlas->fonts) {
            atlas->fonts = font;
            font->next = 0;
        } else {
            struct nk_font *i = atlas->fonts;
            while (i->next) i = i->next;
            i->next = font;
            font->next = 0;
        }
        cfg->font = &font->info;
    } else {
        /* extend previously added font */
        struct nk_font *f = 0;
        struct nk_font_config *c = 0;
        NK_ASSERT(atlas->font_num);
        f = atlas->fonts;
        c = f->config;
        cfg->font = &f->info;

        cfg->n = c;
        cfg->p = c->p;
        c->p->n = cfg;
        c->p = cfg;
    }
    /* create own copy of .TTF font blob */
    if (!config->ttf_data_owned_by_atlas) {
        cfg->ttf_blob = atlas->permanent.alloc(atlas->permanent.userdata,0, cfg->ttf_size);
        NK_ASSERT(cfg->ttf_blob);
        if (!cfg->ttf_blob) {
            atlas->font_num++;
            return 0;
        }
        NK_MEMCPY(cfg->ttf_blob, config->ttf_blob, cfg->ttf_size);
        cfg->ttf_data_owned_by_atlas = 1;
    }
    atlas->font_num++;
    return font;
}